

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O1

void * tommy_hashdyn_remove(tommy_hashdyn *hashdyn,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashdyn_node *ptVar2;
  tommy_hashdyn_node **pptVar3;
  tommy_hashdyn_node *ptVar4;
  tommy_hashdyn_node *ptVar5;
  int iVar6;
  void *pvVar7;
  tommy_node_struct *ptVar8;
  tommy_hashdyn_node *ptVar9;
  uint uVar10;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = hashdyn->bucket_mask & hash;
  ptVar2 = hashdyn->bucket[uVar10];
  do {
    if (ptVar2 == (tommy_hashdyn_node *)0x0) {
      pvVar7 = (void *)0x0;
LAB_001117ab:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return pvVar7;
      }
      __stack_chk_fail();
    }
    if ((ptVar2->key == hash) && (iVar6 = (*(code *)cmp)(cmp_arg,ptVar2->data), iVar6 == 0)) {
      pptVar3 = hashdyn->bucket;
      ptVar4 = pptVar3[uVar10];
      ptVar5 = ptVar2->next;
      ptVar9 = ptVar5;
      if (ptVar5 == (tommy_hashdyn_node *)0x0) {
        ptVar9 = ptVar4;
      }
      ptVar9->prev = ptVar2->prev;
      if (ptVar4 == ptVar2) {
        ptVar8 = (tommy_node_struct *)(pptVar3 + uVar10);
      }
      else {
        ptVar8 = ptVar2->prev;
      }
      ptVar8->next = ptVar5;
      uVar10 = hashdyn->count - 1;
      hashdyn->count = uVar10;
      if ((uVar10 <= hashdyn->bucket_max >> 3) && (4 < hashdyn->bucket_bit)) {
        tommy_hashdyn_resize(hashdyn,hashdyn->bucket_bit - 1);
      }
      pvVar7 = ptVar2->data;
      goto LAB_001117ab;
    }
    ptVar2 = ptVar2->next;
  } while( true );
}

Assistant:

void* tommy_hashdyn_remove(tommy_hashdyn* hashdyn, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashdyn->bucket_mask;
	tommy_hashdyn_node* node = hashdyn->bucket[pos];

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(&hashdyn->bucket[pos], node);

			--hashdyn->count;

			hashdyn_shrink_step(hashdyn);

			return node->data;
		}
		node = node->next;
	}

	return 0;
}